

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O2

int setup_roaring_add_offset_test(void **state_)

{
  void *pvVar1;
  roaring_bitmap_t *prVar2;
  
  pvVar1 = *state_;
  prVar2 = roaring_bitmap_of_ptr(*(size_t *)((long)pvVar1 + 0x10),*(uint32_t **)((long)pvVar1 + 8));
  *(roaring_bitmap_t **)((long)pvVar1 + 0x20) = prVar2;
  _assert_true((ulong)(prVar2 != (roaring_bitmap_t *)0x0),"state->in != NULL",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
               ,0xa7);
  return 0;
}

Assistant:

static int setup_roaring_add_offset_test(void **state_) {
    roaring_add_offset_test_state_t *state =
        *(roaring_add_offset_test_state_t **)state_;
    roaring_add_offset_test_case_t test = state->test_case;

    state->in = roaring_bitmap_of_ptr(test.n_values, test.values);
    assert_true(state->in != NULL);

    return 0;
}